

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O1

VisitError<typename_Visitor::ResultType> * __thiscall
Fixpp::visit<should_skip_unknown_tags::Visitor,should_skip_unknown_tags::VisitRules>
          (VisitError<void> *__return_storage_ptr__,Fixpp *this,long frame,undefined8 size)

{
  undefined1 *this_00;
  undefined1 *this_01;
  undefined1 local_f0 [8];
  TypedParsingContext<void> context;
  RawStreamBuf<char> streambuf;
  StreamCursor cursor;
  
  this_00 = &streambuf.super_StreamBuf<char>.field_0x30;
  context.super_ParsingContext.sum = (size_t)__assert_fail;
  streambuf.super_StreamBuf<char>.super_basic_streambuf<char,_std::char_traits<char>_> =
       (basic_streambuf<char,_std::char_traits<char>_>)0x0;
  streambuf.super_StreamBuf<char>._1_7_ = 0;
  streambuf.super_StreamBuf<char>._8_8_ = 0;
  streambuf.super_StreamBuf<char>._16_8_ = 0;
  streambuf.super_StreamBuf<char>._24_8_ = 0;
  streambuf.super_StreamBuf<char>._32_8_ = 0;
  streambuf.super_StreamBuf<char>._40_8_ = 0;
  std::locale::locale((locale *)this_00);
  context.super_ParsingContext.sum = (size_t)&PTR__streambuf_00ad9d98;
  streambuf.super_StreamBuf<char>._16_8_ = this + frame;
  streambuf.super_StreamBuf<char>._56_8_ = &context.super_ParsingContext.sum;
  this_01 = &streambuf.super_StreamBuf<char>.field_0x38;
  streambuf.super_StreamBuf<char>._0_8_ = this;
  streambuf.super_StreamBuf<char>._8_8_ = this;
  StreamCursor::advance((StreamCursor *)this_01,0);
  context.super_ParsingContext.error.storage_.__data[0x28] = '\x01';
  context.super_ParsingContext.error.empty_ = false;
  context.super_ParsingContext.error._49_7_ = 0;
  context.super_ParsingContext.version.first = (char *)0x0;
  context.super_ParsingContext.bodyLength = 0;
  context.super_ParsingContext._84_4_ = 0;
  context.super_ParsingContext.msgType.first = (char *)0x0;
  context.super_ParsingContext.msgType.second = 0;
  local_f0 = (undefined1  [8])this_01;
  visitMessage<should_skip_unknown_tags::Visitor,should_skip_unknown_tags::VisitRules,Fixpp::TypedParsingContext<void>>
            (local_f0,size);
  TypedParsingContext<void>::toVisitError
            (__return_storage_ptr__,(TypedParsingContext<void> *)local_f0);
  context.super_ParsingContext.sum = (size_t)__assert_fail;
  std::locale::~locale((locale *)this_00);
  return __return_storage_ptr__;
}

Assistant:

auto visit(const char* frame, size_t size, Visitor& visitor, Rules rules) -> VisitError<typename Visitor::ResultType>
    {
        static_assert(
            meta::is_detected<impl::rules::HasResultType, Visitor>::value,
            "Visitor must fulfill StaticVisitor requirement and must expose an inner ResultType type"
        );
        checkRules<Rules>();

        RawStreamBuf<> streambuf(const_cast<char *>(frame), size);
        StreamCursor cursor(&streambuf);

        using ResultType = typename Visitor::ResultType;

        TypedParsingContext<ResultType> context(cursor);
        visitMessage(context, visitor, rules);

        return context.toVisitError();
    }